

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O0

void __thiscall llvm::APFloat::makeInf(APFloat *this,bool Neg)

{
  bool bVar1;
  fltSemantics *pfVar2;
  bool Neg_local;
  APFloat *this_local;
  
  pfVar2 = getSemantics(this);
  bVar1 = usesLayout<llvm::detail::IEEEFloat>(pfVar2);
  if (bVar1) {
    detail::IEEEFloat::makeInf(&(this->U).IEEE,Neg);
  }
  else {
    pfVar2 = getSemantics(this);
    bVar1 = usesLayout<llvm::detail::DoubleAPFloat>(pfVar2);
    if (!bVar1) {
      llvm_unreachable_internal
                ("Unexpected semantics",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APFloat.h"
                 ,0x31c);
    }
    detail::DoubleAPFloat::makeInf((DoubleAPFloat *)&(this->U).IEEE,Neg);
  }
  return;
}

Assistant:

void makeInf(bool Neg) { APFLOAT_DISPATCH_ON_SEMANTICS(makeInf(Neg)); }